

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode cf_setup_create(Curl_cfilter **pcf,Curl_easy *data,Curl_dns_entry *remotehost,int transport
                        ,int ssl_mode)

{
  CURLcode CVar1;
  undefined4 *ctx;
  Curl_cfilter *pCVar2;
  undefined4 *puVar3;
  Curl_cfilter *cf;
  Curl_cfilter *local_30;
  
  local_30 = (Curl_cfilter *)0x0;
  ctx = (undefined4 *)(*Curl_ccalloc)(1,0x18);
  if (ctx == (undefined4 *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
    puVar3 = (undefined4 *)0x0;
  }
  else {
    *ctx = 0;
    *(Curl_easy **)(ctx + 2) = data;
    ctx[4] = transport;
    ctx[5] = (int)remotehost;
    CVar1 = Curl_cf_create(&local_30,&Curl_cft_setup,ctx);
    puVar3 = (undefined4 *)0x0;
    if (CVar1 != CURLE_OK) {
      puVar3 = ctx;
    }
  }
  pCVar2 = local_30;
  if (CVar1 != CURLE_OK) {
    pCVar2 = (Curl_cfilter *)0x0;
  }
  *pcf = pCVar2;
  (*Curl_cfree)(puVar3);
  return CVar1;
}

Assistant:

static CURLcode cf_setup_create(struct Curl_cfilter **pcf,
                                struct Curl_easy *data,
                                const struct Curl_dns_entry *remotehost,
                                int transport,
                                int ssl_mode)
{
  struct Curl_cfilter *cf = NULL;
  struct cf_setup_ctx *ctx;
  CURLcode result = CURLE_OK;

  (void)data;
  ctx = calloc(1, sizeof(*ctx));
  if(!ctx) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }
  ctx->state = CF_SETUP_INIT;
  ctx->remotehost = remotehost;
  ctx->ssl_mode = ssl_mode;
  ctx->transport = transport;

  result = Curl_cf_create(&cf, &Curl_cft_setup, ctx);
  if(result)
    goto out;
  ctx = NULL;

out:
  *pcf = result? NULL : cf;
  free(ctx);
  return result;
}